

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineBase.cpp
# Opt level: O0

void __thiscall myvk::PipelineBase::~PipelineBase(PipelineBase *this)

{
  PFN_vkDestroyPipeline p_Var1;
  element_type *peVar2;
  element_type *this_00;
  VkDevice pVVar3;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__PipelineBase_00530fb8;
  p_Var1 = vkDestroyPipeline;
  if (in_RDI[5] != 0) {
    peVar2 = std::
             __shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ea725);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ea742);
    pVVar3 = Device::GetHandle(this_00);
    (*p_Var1)(pVVar3,(VkPipeline)in_RDI[5],(VkAllocationCallbacks *)0x0);
  }
  std::shared_ptr<myvk::PipelineLayout>::~shared_ptr((shared_ptr<myvk::PipelineLayout> *)0x2ea77a);
  DeviceObjectBase::~DeviceObjectBase((DeviceObjectBase *)0x2ea784);
  return;
}

Assistant:

PipelineBase::~PipelineBase() {
	if (m_pipeline)
		vkDestroyPipeline(m_pipeline_layout_ptr->GetDevicePtr()->GetHandle(), m_pipeline, nullptr);
}